

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_subquery.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::Binder::PlanSubquery
          (Binder *this,BoundSubqueryExpression *expr,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *root)

{
  shared_ptr<duckdb::Binder,_true> *this_00;
  LogicalType *other;
  vector<duckdb::LogicalType,_true> *this_01;
  char cVar1;
  ExpressionType EVar2;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var3;
  element_type *peVar4;
  ulong uVar5;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var6;
  _func_int **pp_Var7;
  ColumnBinding binding;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *puVar8;
  undefined1 auVar9 [8];
  _Head_base<0UL,_duckdb::LogicalAggregate_*,_false> _Var10;
  _Head_base<0UL,_duckdb::LogicalProjection_*,_false> _Var11;
  undefined8 uVar12;
  bool bVar13;
  Binder *pBVar14;
  pointer pLVar15;
  pointer pLVar16;
  reference pvVar17;
  LogicalLimit *this_02;
  pointer this_03;
  BoundAtClause *pBVar18;
  ClientConfig *pCVar19;
  BoundColumnRefExpression *pBVar20;
  LogicalOperator *aggregate_index;
  LogicalAggregate *pLVar21;
  LogicalOperator *table_index;
  pointer pEVar22;
  __uniq_ptr_impl<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>_>
  this_04;
  BoundConstantExpression *this_05;
  pointer pBVar23;
  pointer pBVar24;
  ClientContext *pCVar25;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> this_06;
  pointer pLVar26;
  reference pvVar27;
  reference pvVar28;
  pointer pBVar29;
  idx_t iVar30;
  idx_t group_index;
  pointer pLVar31;
  _Head_base<0UL,_duckdb::LogicalDependentJoin_*,_false> this_07;
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> _Var32;
  tuple<duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_> this_08;
  LogicalDependentJoin *table_index_00;
  LogicalProjection *this_09;
  pointer pLVar33;
  type op;
  NotImplementedException *this_10;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RCX;
  long lVar34;
  _Head_base<0UL,_duckdb::BoundComparisonExpression_*,_false> _Var35;
  undefined8 *puVar36;
  undefined8 *puVar37;
  pointer *__ptr;
  vector<duckdb::CorrelatedColumnInfo,_true> *correlated_columns;
  size_type __n;
  byte bVar38;
  ColumnBinding binding_00;
  ColumnBinding binding_01;
  ColumnBinding binding_02;
  ColumnBinding binding_03;
  templated_unique_single_t first_ref;
  templated_unique_single_t aggregate;
  templated_unique_single_t count_check;
  templated_unique_single_t aggr;
  templated_unique_single_t projection;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  projection_list;
  LogicalType idx_type;
  vector<duckdb::ColumnBinding,_true> bindings;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  aggregate_list;
  templated_unique_single_t limit;
  unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
  count_star;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  subquery_root;
  templated_unique_single_t proj;
  templated_unique_single_t case_expr;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> error_expr;
  FunctionBinder function_binder_1;
  FunctionBinder function_binder;
  unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
  delim_join;
  shared_ptr<duckdb::Binder,_true> sub_binder;
  AggregateFunction count_star_fun;
  value_type plan_column;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_5c0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_5b8;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_5b0
  ;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_5a8;
  Binder *local_5a0;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_598
  ;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_590;
  undefined1 local_588 [8];
  _Head_base<0UL,_duckdb::BoundComparisonExpression_*,_false> local_580;
  _Head_base<0UL,_duckdb::LogicalAggregate_*,_false> local_578;
  _Head_base<0UL,_duckdb::LogicalProjection_*,_false> local_570;
  undefined1 local_568 [8];
  ClientContext *pCStack_560;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_558 [3];
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_528;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_520;
  LogicalType local_518;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_4f8;
  undefined1 local_4d8 [8];
  element_type *peStack_4d0;
  _Alloc_hider local_4c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  optional_idx local_4a8;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_498;
  undefined1 local_480 [16];
  __uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> local_470;
  FunctionBinder local_468;
  undefined1 local_458 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_440;
  undefined1 local_428 [32];
  undefined1 local_408 [16];
  undefined1 local_3f8 [280];
  undefined1 local_2e0 [40];
  undefined1 local_2b8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_2a0 [7];
  LogicalType LStack_228;
  FunctionStability local_210;
  FunctionNullHandling FStack_20f;
  FunctionErrors FStack_20e;
  FunctionCollationHandling FStack_20d;
  undefined8 auStack_208 [13];
  _Any_data local_1a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_188;
  BaseScalarFunction local_168;
  undefined8 auStack_b8 [13];
  undefined2 local_50;
  size_type local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  
  bVar38 = 0;
  local_5b0 = root;
  local_5a0 = (Binder *)expr;
  local_598 = in_RCX;
  CreateBinder((Binder *)local_2e0,
               (ClientContext *)(expr->super_Expression).super_BaseExpression.alias._M_dataplus._M_p
               ,(optional_ptr<duckdb::Binder,_true>)expr,REGULAR_BINDER);
  pBVar14 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)local_2e0);
  pBVar14->is_outside_flattened = false;
  pBVar14 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)local_2e0);
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::operator*
            ((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)(local_5b0 + 0xd));
  CreatePlan((Binder *)local_480,(BoundQueryNode *)pBVar14);
  uVar12 = local_480._0_8_;
  local_480._0_8_ =
       (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)0x0
  ;
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  this_00 = (shared_ptr<duckdb::Binder,_true> *)(local_5b0 + 0xb);
  pBVar14 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
  if ((pBVar14->correlated_columns).
      super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
      super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pBVar14->correlated_columns).
      super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
      super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_590._M_head_impl = (LogicalOperator *)uVar12;
    pBVar14 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
    correlated_columns = &pBVar14->correlated_columns;
    bVar13 = true;
    if (*(char *)&local_5b0[0xe].
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl != '\x04') {
      bVar13 = PerformDuplicateElimination(local_5a0,correlated_columns);
    }
    cVar1 = *(char *)&local_5b0[0xe].
                      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    if (cVar1 == '\x02') {
      pBVar18 = (BoundAtClause *)GenerateTableIndex(local_5a0);
      local_568 = (undefined1  [8])
                  (local_598->
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (local_598->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      CreateDuplicateEliminatedJoin
                ((duckdb *)local_408,correlated_columns,MARK,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)local_568,bVar13);
      if ((tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)local_568
          != (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0) {
        (*(*(_func_int ***)local_568)[1])();
      }
      local_568 = (undefined1  [8])0x0;
      pLVar15 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)local_408);
      pLVar15->subquery_type = EXISTS;
      pLVar15 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)local_408);
      (pLVar15->super_LogicalComparisonJoin).super_LogicalJoin.mark_index = (idx_t)pBVar18;
      pLVar15 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)local_408);
      pLVar15->any_join = true;
      pLVar15 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)local_408);
      local_4f8.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_590._M_head_impl;
      local_590._M_head_impl = (LogicalOperator *)0x0;
      LogicalOperator::AddChild
                ((LogicalOperator *)pLVar15,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_4f8);
      if ((element_type *)
          local_4f8.
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                     &(local_4f8.
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                     )->__weak_this_).internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      uVar12 = local_408._0_8_;
      local_4f8.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_408._0_8_ =
           (_Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
            )0x0;
      _Var3._M_head_impl =
           (local_598->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (local_598->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (LogicalOperator *)uVar12;
      if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)((long)(_Var3._M_head_impl)->_vptr_LogicalOperator + 8))();
      }
      puVar8 = local_5b0;
      (*(code *)(((local_5b0->
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->
                expressions).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)(local_2b8,local_5b0);
      local_168.super_SimpleFunction.super_Function.name._M_dataplus._M_p = (pointer)0x0;
      local_168.super_SimpleFunction.super_Function._vptr_Function = (_func_int **)pBVar18;
      make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding>
                ((duckdb *)&local_518,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                 (LogicalType *)(puVar8 + 7),(ColumnBinding *)&local_168);
    }
    else if (cVar1 == '\x01') {
      local_568 = (undefined1  [8])
                  (local_598->
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (local_598->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      CreateDuplicateEliminatedJoin
                ((duckdb *)local_408,correlated_columns,SINGLE,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)local_568,bVar13);
      if ((tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)local_568
          != (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0) {
        (*(*(_func_int ***)local_568)[1])();
      }
      local_568 = (undefined1  [8])0x0;
      pLVar15 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)local_408);
      pLVar15->subquery_type = SCALAR;
      pLVar15 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)local_408);
      pLVar15->any_join = false;
      pLVar16 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)&local_590);
      (*pLVar16->_vptr_LogicalOperator[2])(local_2b8,pLVar16);
      pvVar17 = vector<duckdb::ColumnBinding,_true>::back
                          ((vector<duckdb::ColumnBinding,_true> *)local_2b8);
      local_168.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)pvVar17->table_index;
      local_168.super_SimpleFunction.super_Function.name._M_dataplus._M_p =
           (pointer)pvVar17->column_index;
      if ((_Hash_node_base *)local_2b8._0_8_ != (_Hash_node_base *)0x0) {
        operator_delete((void *)local_2b8._0_8_);
      }
      pLVar15 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)local_408);
      local_4f8.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_590._M_head_impl;
      local_590._M_head_impl = (LogicalOperator *)0x0;
      LogicalOperator::AddChild
                ((LogicalOperator *)pLVar15,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_4f8);
      if ((element_type *)
          local_4f8.
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                     &(local_4f8.
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                     )->__weak_this_).internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      uVar12 = local_408._0_8_;
      local_4f8.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_408._0_8_ =
           (_Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
            )0x0;
      _Var3._M_head_impl =
           (local_598->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (local_598->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (LogicalOperator *)uVar12;
      if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)((long)(_Var3._M_head_impl)->_vptr_LogicalOperator + 8))();
      }
      puVar8 = local_5b0;
      (*(code *)(((local_5b0->
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->
                expressions).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)(local_2b8,local_5b0);
      make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding&>
                ((duckdb *)&local_518,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                 (LogicalType *)(puVar8 + 7),(ColumnBinding *)&local_168);
    }
    else {
      pBVar18 = (BoundAtClause *)GenerateTableIndex(local_5a0);
      local_568 = (undefined1  [8])
                  (local_598->
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (local_598->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      CreateDuplicateEliminatedJoin
                ((duckdb *)local_408,correlated_columns,MARK,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)local_568,bVar13);
      if ((tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)local_568
          != (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0) {
        (*(*(_func_int ***)local_568)[1])();
      }
      local_568 = (undefined1  [8])0x0;
      pLVar15 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)local_408);
      pLVar15->subquery_type = ANY;
      pLVar15 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)local_408);
      (pLVar15->super_LogicalComparisonJoin).super_LogicalJoin.mark_index = (idx_t)pBVar18;
      pLVar15 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)local_408);
      pLVar15->any_join = true;
      if (8 < (ulong)((long)local_5b0[0x10].
                            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl -
                     (long)local_5b0[0xf].
                           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)) {
        local_5b8._M_head_impl = (Expression *)this;
        this_10 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_2b8._0_8_ = local_2b8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2b8,
                   "Correlated IN/ANY/ALL with multiple columns not yet supported","");
        NotImplementedException::NotImplementedException(this_10,(string *)local_2b8);
        __cxa_throw(this_10,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      pLVar15 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)local_408);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::_M_move_assign(&(pLVar15->expression_children).
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ,local_5b0 + 0xf);
      pLVar15 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)local_408);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                (&(pLVar15->child_types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_5b0 + 0x13));
      pLVar15 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)local_408);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                (&(pLVar15->child_targets).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_5b0 + 0x16));
      EVar2 = *(ExpressionType *)
               &local_5b0[0x12].
                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      pLVar15 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)local_408);
      pLVar15->comparison_type = EVar2;
      pLVar15 = unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true>
                              *)local_408);
      local_4f8.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_590._M_head_impl;
      local_590._M_head_impl = (LogicalOperator *)0x0;
      LogicalOperator::AddChild
                ((LogicalOperator *)pLVar15,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_4f8);
      if ((element_type *)
          local_4f8.
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                     &(local_4f8.
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                     )->__weak_this_).internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      uVar12 = local_408._0_8_;
      local_4f8.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_408._0_8_ =
           (_Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
            )0x0;
      _Var3._M_head_impl =
           (local_598->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (local_598->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (LogicalOperator *)uVar12;
      if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)((long)(_Var3._M_head_impl)->_vptr_LogicalOperator + 8))();
      }
      puVar8 = local_5b0;
      (*(code *)(((local_5b0->
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->
                expressions).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)(local_2b8,local_5b0);
      local_168.super_SimpleFunction.super_Function.name._M_dataplus._M_p = (pointer)0x0;
      local_168.super_SimpleFunction.super_Function._vptr_Function = (_func_int **)pBVar18;
      make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding>
                ((duckdb *)&local_518,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                 (LogicalType *)(puVar8 + 7),(ColumnBinding *)&local_168);
    }
    uVar12 = local_518._0_8_;
    local_518._0_8_ =
         (_Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
          )0x0;
    if ((_Hash_node_base *)local_2b8._0_8_ != (_Hash_node_base *)(local_2b8 + 0x10)) {
      operator_delete((void *)local_2b8._0_8_);
    }
    if ((LogicalDependentJoin *)local_408._0_8_ != (LogicalDependentJoin *)0x0) {
      (**(code **)(*(undefined **)local_408._0_8_ + 8))();
    }
    peVar4 = (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
             super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar12;
    if (peVar4 != (element_type *)0x0) {
      (**(code **)(*(long *)&(peVar4->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ +
                  8))();
    }
    if (local_590._M_head_impl != (LogicalOperator *)0x0) {
      (*(local_590._M_head_impl)->_vptr_LogicalOperator[1])();
    }
    local_590._M_head_impl = (LogicalOperator *)0x0;
    goto LAB_00dbd832;
  }
  local_5c0._M_head_impl = (LogicalOperator *)uVar12;
  cVar1 = *(char *)&local_5b0[0xe].
                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  if (cVar1 == '\x01') {
    local_5b8._M_head_impl = (Expression *)this;
    pLVar16 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)&local_5c0);
    (*pLVar16->_vptr_LogicalOperator[2])(&local_4f8);
    pvVar17 = vector<duckdb::ColumnBinding,_true>::operator[]
                        ((vector<duckdb::ColumnBinding,_true> *)&local_4f8,0);
    uVar5 = pvVar17->table_index;
    pCVar19 = ClientConfig::GetConfig
                        ((ClientContext *)(((string *)&local_5a0->context)->_M_dataplus)._M_p);
    bVar13 = pCVar19->scalar_subquery_error_on_multiple_rows;
    local_518._0_8_ =
         (_Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
          )0x0;
    local_518.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_518.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pBVar20 = (BoundColumnRefExpression *)operator_new(0x70);
    other = (LogicalType *)(local_5b0 + 7);
    LogicalType::LogicalType((LogicalType *)local_2b8,other);
    binding_00.column_index = 0;
    binding_00.table_index = uVar5;
    BoundColumnRefExpression::BoundColumnRefExpression
              (pBVar20,(LogicalType *)local_2b8,binding_00,0);
    LogicalType::~LogicalType((LogicalType *)local_2b8);
    local_4d8 = (undefined1  [8])0x0;
    peStack_4d0 = (element_type *)0x0;
    local_4c8._M_p = (pointer)0x0;
    local_2b8._0_8_ = pBVar20;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)local_4d8,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               local_2b8);
    if ((BoundColumnRefExpression *)local_2b8._0_8_ != (BoundColumnRefExpression *)0x0) {
      (*(((Expression *)local_2b8._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    FunctionBinder::FunctionBinder((FunctionBinder *)local_458,local_5a0);
    FirstFunctionGetter::GetFunction((AggregateFunction *)local_2b8,other);
    local_428._0_8_ = local_4d8;
    local_428._8_8_ = peStack_4d0;
    local_428._16_8_ = local_4c8._M_p;
    local_4d8 = (undefined1  [8])0x0;
    peStack_4d0 = (element_type *)0x0;
    local_4c8._M_p = (pointer)0x0;
    local_520._M_head_impl = (LogicalOperator *)0x0;
    FunctionBinder::BindAggregateFunction
              ((FunctionBinder *)local_588,(AggregateFunction *)local_458,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)local_2b8,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               local_428,(AggregateType)&local_520);
    if (local_520._M_head_impl != (LogicalOperator *)0x0) {
      (*(local_520._M_head_impl)->_vptr_LogicalOperator[1])();
    }
    local_520._M_head_impl = (LogicalOperator *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_428);
    local_2b8._0_8_ = &PTR__AggregateFunction_0247e830;
    if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190._M_pi);
    }
    BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_2b8);
    local_168.super_SimpleFunction.super_Function._vptr_Function = (_func_int **)local_588;
    local_588 = (undefined1  [8])0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&local_518,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_168);
    if ((BoundAtClause *)local_168.super_SimpleFunction.super_Function._vptr_Function !=
        (BoundAtClause *)0x0) {
      (**(code **)((((string *)local_168.super_SimpleFunction.super_Function._vptr_Function)->
                   _M_dataplus)._M_p + 8))();
    }
    if (bVar13 != false) {
      local_408._0_8_ =
           (tuple<duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
            )0x0;
      local_408._8_8_ = (ClientContext *)0x0;
      local_3f8._0_8_ = (pointer)0x0;
      CountStarFun::GetFunction();
      local_188.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_408._0_8_;
      local_188.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_408._8_8_;
      local_188.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_3f8._0_8_;
      local_408._0_8_ =
           (__uniq_ptr_data<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>,_true,_true>
            )0x0;
      local_408._8_8_ = (ClientContext *)0x0;
      local_3f8._0_8_ = (Binder *)0x0;
      local_570._M_head_impl = (LogicalProjection *)0x0;
      FunctionBinder::BindAggregateFunction
                ((FunctionBinder *)local_568,(AggregateFunction *)local_458,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)&local_168,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_188,(AggregateType)&local_570);
      if (local_570._M_head_impl != (LogicalProjection *)0x0) {
        (*((local_570._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
      }
      local_570._M_head_impl = (LogicalProjection *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector(&local_188);
      local_168.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__AggregateFunction_0247e830;
      if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_168);
      local_4b8._M_allocated_capacity = (size_type)local_568;
      local_568 = (undefined1  [8])0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_518,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_4b8._M_allocated_capacity);
      if ((LogicalOperator *)local_4b8._M_allocated_capacity != (LogicalOperator *)0x0) {
        (**(code **)(*(long *)local_4b8._M_allocated_capacity + 8))();
      }
      if (local_568 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_568 + 8))();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_408);
    }
    pBVar14 = local_5a0;
    aggregate_index = (LogicalOperator *)GenerateTableIndex(local_5a0);
    iVar30 = GenerateTableIndex(pBVar14);
    pLVar21 = (LogicalAggregate *)operator_new(0xe0);
    local_408[0] = local_518.id_;
    local_408[1] = local_518.physical_type_;
    local_408._2_6_ = local_518._2_6_;
    local_408._8_8_ =
         local_518.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_3f8._0_8_ =
         local_518.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_518._0_8_ =
         (_Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
          )0x0;
    local_518.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_518.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    LogicalAggregate::LogicalAggregate
              (pLVar21,iVar30,(idx_t)aggregate_index,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)local_408);
    local_578._M_head_impl = pLVar21;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_408);
    pLVar31 = unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
              ::operator->((unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
                            *)&local_578);
    local_528._M_head_impl = local_5c0._M_head_impl;
    local_5c0._M_head_impl = (LogicalOperator *)0x0;
    LogicalOperator::AddChild
              (&pLVar31->super_LogicalOperator,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_528);
    if ((element_type *)local_528._M_head_impl != (element_type *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                   &(local_528._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    _Var10._M_head_impl = local_578._M_head_impl;
    _Var3._M_head_impl = local_5c0._M_head_impl;
    local_528._M_head_impl = (LogicalOperator *)0x0;
    local_578._M_head_impl = (LogicalAggregate *)0x0;
    local_5c0._M_head_impl = &(_Var10._M_head_impl)->super_LogicalOperator;
    if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
      (*(_Var3._M_head_impl)->_vptr_LogicalOperator[1])();
    }
    this = (Binder *)local_5b8;
    if (bVar13 != false) {
      table_index = (LogicalOperator *)GenerateTableIndex(local_5a0);
      pLVar16 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)&local_5c0);
      pvVar27 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](&pLVar16->expressions,0);
      pEVar22 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(pvVar27);
      pBVar20 = (BoundColumnRefExpression *)operator_new(0x70);
      LogicalType::LogicalType((LogicalType *)local_408,&pEVar22->return_type);
      binding_01.column_index = 0;
      binding_01.table_index = (idx_t)aggregate_index;
      BoundColumnRefExpression::BoundColumnRefExpression
                (pBVar20,(LogicalType *)local_408,binding_01,0);
      local_5a8._M_head_impl = (LogicalOperator *)pBVar20;
      LogicalType::~LogicalType((LogicalType *)local_408);
      pLVar16 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)&local_5c0);
      pvVar27 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](&pLVar16->expressions,1);
      pEVar22 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(pvVar27);
      this_04._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
      .super__Head_base<0UL,_duckdb::LogicalDependentJoin_*,_false>._M_head_impl =
           (tuple<duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
            )operator_new(0x70);
      LogicalType::LogicalType((LogicalType *)local_408,&pEVar22->return_type);
      binding_02.column_index = 1;
      binding_02.table_index = (idx_t)aggregate_index;
      BoundColumnRefExpression::BoundColumnRefExpression
                ((BoundColumnRefExpression *)
                 this_04._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
                 .super__Head_base<0UL,_duckdb::LogicalDependentJoin_*,_false>._M_head_impl,
                 (LogicalType *)local_408,binding_02,0);
      LogicalType::~LogicalType((LogicalType *)local_408);
      Value::BIGINT((Value *)local_568,1);
      _Var32.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)operator_new(0x98);
      Value::Value((Value *)local_408,(Value *)local_568);
      BoundConstantExpression::BoundConstantExpression
                ((BoundConstantExpression *)
                 _Var32.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
                 (Value *)local_408);
      Value::~Value((Value *)local_408);
      Value::~Value((Value *)local_568);
      pCVar25 = (ClientContext *)operator_new(0x68);
      local_568 = (undefined1  [8])
                  _Var32.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      local_408._0_8_ =
           this_04._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
           .super__Head_base<0UL,_duckdb::LogicalDependentJoin_*,_false>._M_head_impl;
      BoundComparisonExpression::BoundComparisonExpression
                ((BoundComparisonExpression *)pCVar25,COMPARE_GREATERTHAN,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_408,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_568);
      this = (Binder *)local_5b8;
      local_580._M_head_impl = (BoundComparisonExpression *)pCVar25;
      if ((tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)local_568
          != (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0) {
        (*(((Expression *)local_568)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_568 = (undefined1  [8])0x0;
      if ((LogicalDependentJoin *)local_408._0_8_ != (LogicalDependentJoin *)0x0) {
        (**(code **)(*(long *)local_408._0_8_ + 8))();
      }
      local_4b8._M_allocated_capacity = 0;
      local_4b8._8_8_ = 0;
      local_4a8.index = 0;
      Value::Value((Value *)local_568,
                   "More than one row returned by a subquery used as an expression - scalar subqueries can only return a single row.\n\nUse \"SET scalar_subquery_error_on_multiple_rows=false\" to revert to previous behavior of returning a random row."
                  );
      this_05 = (BoundConstantExpression *)operator_new(0x98);
      Value::Value((Value *)local_408,(Value *)local_568);
      BoundConstantExpression::BoundConstantExpression(this_05,(Value *)local_408);
      Value::~Value((Value *)local_408);
      local_458._16_8_ = this_05;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)local_4b8._M_local_buf,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 (local_458 + 0x10));
      if ((BoundConstantExpression *)local_458._16_8_ != (BoundConstantExpression *)0x0) {
        (*(((Expression *)local_458._16_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_458._16_8_ = 0;
      Value::~Value((Value *)local_568);
      ErrorFun::GetFunction();
      local_458._16_8_ = local_4b8._M_allocated_capacity;
      aStack_440._M_allocated_capacity = local_4b8._8_8_;
      aStack_440._8_8_ = local_4a8.index;
      local_4b8._M_allocated_capacity = 0;
      local_4b8._8_8_ = 0;
      local_4a8.index = 0;
      FunctionBinder::BindScalarFunction
                (&local_468,(ScalarFunction *)local_458,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)local_408,(bool)((char)local_458 + '\x10'),
                 (optional_ptr<duckdb::Binder,_true>)0x0);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)(local_458 + 0x10));
      local_408._0_8_ = &PTR__ScalarFunction_0247e7f0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f8._272_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f8._272_8_);
      }
      if ((__node_base_ptr)local_3f8._176_8_ != (__node_base_ptr)0x0) {
        (*(code *)local_3f8._176_8_)(local_3f8 + 0xa0,local_3f8 + 0xa0,3);
      }
      BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_408);
      pBVar23 = unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                              *)&local_5a8);
      pBVar24 = (pointer)unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                       *)&local_468);
      if (pBVar24 != pBVar23) {
        (pBVar24->super_Expression).return_type.id_ = (pBVar23->super_Expression).return_type.id_;
        (pBVar24->super_Expression).return_type.physical_type_ =
             (pBVar23->super_Expression).return_type.physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&(pBVar24->super_Expression).return_type.type_info_,
                   &(pBVar23->super_Expression).return_type.type_info_);
      }
      make_uniq<duckdb::BoundCaseExpression,duckdb::unique_ptr<duckdb::BoundComparisonExpression,std::default_delete<duckdb::BoundComparisonExpression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::BoundColumnRefExpression,std::default_delete<duckdb::BoundColumnRefExpression>,true>>
                ((duckdb *)&local_470,
                 (unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>,_true>
                  *)&local_580,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_468,
                 (unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                  *)&local_5a8);
      local_568 = (undefined1  [8])
                  local_470._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      local_498.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_498.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_498.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_470._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
           (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            )0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_498,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_568);
      if (local_568 != (undefined1  [8])0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)local_568)->__weak_this_).
                    internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                  internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)();
      }
      pLVar21 = (LogicalAggregate *)operator_new(0x70);
      local_568 = (undefined1  [8])
                  local_498.
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      pCStack_560 = (ClientContext *)
                    local_498.
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      local_558[0]._M_allocated_capacity =
           local_498.
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_498.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_498.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_498.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      LogicalProjection::LogicalProjection
                ((LogicalProjection *)pLVar21,(idx_t)table_index,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)local_568);
      local_480._8_8_ = pLVar21;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_568);
      pLVar33 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                              *)(local_480 + 8));
      local_468.context = (ClientContext *)local_5c0._M_head_impl;
      local_5c0._M_head_impl = (LogicalOperator *)0x0;
      LogicalOperator::AddChild
                (&pLVar33->super_LogicalOperator,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_468.context);
      if ((_Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>)
          local_468.context != (BoundCastData *)0x0) {
        (**(code **)(*(long *)local_468.context + 8))();
      }
      uVar12 = local_480._8_8_;
      _Var3._M_head_impl = local_5c0._M_head_impl;
      local_468.context = (ClientContext *)0x0;
      local_480._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_5c0._M_head_impl = (LogicalOperator *)uVar12;
      if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
        (*(_Var3._M_head_impl)->_vptr_LogicalOperator[1])();
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_480._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (*(*(_func_int ***)local_480._8_8_)[1])();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector(&local_498);
      if (local_470._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
          (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           )0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)
                     local_470._M_t.
                     super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                     .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->
                    __weak_this_).internal.
                    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)();
      }
      if (local_468.binder.ptr != (Binder *)0x0) {
        (*(code *)((((local_468.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>).
                    __weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&local_4b8);
      if ((ClientContext *)local_580._M_head_impl != (ClientContext *)0x0) {
        (*((local_580._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])
                  ();
      }
      aggregate_index = table_index;
      if ((BoundColumnRefExpression *)local_5a8._M_head_impl != (BoundColumnRefExpression *)0x0) {
        (*(((Expression *)&(local_5a8._M_head_impl)->_vptr_LogicalOperator)->super_BaseExpression).
          _vptr_BaseExpression[1])();
      }
    }
    puVar8 = local_598;
    local_498.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(local_598->
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (local_598->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    local_5a8._M_head_impl = local_5c0._M_head_impl;
    local_5c0._M_head_impl = (LogicalOperator *)0x0;
    LogicalCrossProduct::Create
              ((LogicalCrossProduct *)local_568,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_498,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_5a8);
    auVar9 = local_568;
    local_568 = (undefined1  [8])0x0;
    _Var3._M_head_impl =
         (puVar8->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (puVar8->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (LogicalOperator *)auVar9;
    if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)((long)(_Var3._M_head_impl)->_vptr_LogicalOperator + 8))();
    }
    if ((_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
        local_568 != (LogicalOperator *)0x0) {
      (**(code **)(*(long *)local_568 + 8))();
    }
    local_568 = (undefined1  [8])0x0;
    if ((LogicalAggregate *)local_5a8._M_head_impl != (LogicalAggregate *)0x0) {
      (*((LogicalOperator *)&(local_5a8._M_head_impl)->_vptr_LogicalOperator)->_vptr_LogicalOperator
        [1])();
    }
    local_5a8._M_head_impl = (LogicalOperator *)0x0;
    if ((Binder *)
        local_498.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (Binder *)0x0) {
      (**(_func_int **)
         ((long)(((enable_shared_from_this<duckdb::Binder> *)
                 &(local_498.
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)->
                __weak_this_).internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr + 8))();
    }
    local_498.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (*(code *)(((local_5b0->
                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                )._M_t.
                super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->expressions)
              .
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)(local_568);
    local_4b8._8_8_ = 0;
    local_4b8._M_allocated_capacity = (size_type)aggregate_index;
    make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding>
              ((duckdb *)&local_580,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568,other,
               (ColumnBinding *)&local_4b8);
    _Var35._M_head_impl = local_580._M_head_impl;
    local_580._M_head_impl = (BoundComparisonExpression *)0x0;
    if (local_568 != (undefined1  [8])local_558) {
      operator_delete((void *)local_568);
    }
    if (local_578._M_head_impl != (LogicalAggregate *)0x0) {
      (*((local_578._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
    }
    if (local_588 != (undefined1  [8])0x0) {
      (**(code **)((((string *)local_588)->_M_dataplus)._M_p + 8))();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_4d8);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&local_518);
    pBVar18 = (BoundAtClause *)
              local_4f8.
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
LAB_00dbd271:
    if (pBVar18 != (BoundAtClause *)0x0) {
      operator_delete(pBVar18);
    }
  }
  else {
    if (cVar1 != '\x02') {
      local_5b8._M_head_impl = (Expression *)this;
      pLVar16 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)&local_5c0);
      (*pLVar16->_vptr_LogicalOperator[2])(&local_168,pLVar16);
      pCVar25 = (ClientContext *)GenerateTableIndex(local_5a0);
      this_06._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
            )operator_new(0x118);
      LogicalComparisonJoin::LogicalComparisonJoin
                ((LogicalComparisonJoin *)
                 this_06._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,MARK,
                 LOGICAL_COMPARISON_JOIN);
      local_568 = (undefined1  [8])
                  this_06._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      pLVar26 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                              *)local_568);
      (pLVar26->super_LogicalJoin).mark_index = (idx_t)pCVar25;
      pLVar26 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                              *)local_568);
      local_4f8.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(local_598->
                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    )._M_t.
                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (local_598->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      LogicalOperator::AddChild
                ((LogicalOperator *)pLVar26,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_4f8);
      if ((LogicalOperator *)
          local_4f8.
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (LogicalOperator *)0x0) {
        (*(*(_func_int ***)
            &(local_4f8.
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)[1])();
      }
      local_4f8.
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pLVar26 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                              *)local_568);
      local_518._0_8_ = local_5c0._M_head_impl;
      local_5c0._M_head_impl = (LogicalOperator *)0x0;
      LogicalOperator::AddChild
                ((LogicalOperator *)pLVar26,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_518);
      local_2e0._16_8_ = pCVar25;
      if ((element_type *)local_518._0_8_ != (element_type *)0x0) {
        (*(code *)(((__weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2> *)
                   &(((LogicalComparisonJoin *)local_518._0_8_)->super_LogicalJoin).
                    super_LogicalOperator._vptr_LogicalOperator)->_M_ptr->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      local_518._0_8_ =
           (_Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
            )0x0;
      if (local_5b0[0x10].
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
          local_5b0[0xf].
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl) {
        local_2e0._32_8_ = local_5b0 + 0xf;
        local_2e0._24_8_ = local_5b0 + 0x13;
        this_01 = (vector<duckdb::LogicalType,_true> *)(local_5b0 + 0x16);
        __n = 0;
        do {
          local_408._0_8_ = (_Head_base<0UL,_duckdb::LogicalDependentJoin_*,_false>)0x0;
          local_408._8_8_ = (element_type *)0x0;
          pvVar27 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                  *)local_2e0._32_8_,__n);
          _Var6._M_head_impl =
               (pvVar27->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (pvVar27->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
          if ((__uniq_ptr_impl<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>_>
               )local_408._0_8_ !=
              (__uniq_ptr_impl<duckdb::LogicalDependentJoin,_std::default_delete<duckdb::LogicalDependentJoin>_>
               )0x0) {
            lVar34 = *(long *)local_408._0_8_;
            local_408._0_8_ = _Var6._M_head_impl;
            (**(code **)(lVar34 + 8))();
            _Var6._M_head_impl = (Expression *)local_408._0_8_;
          }
          local_408._0_8_ = _Var6._M_head_impl;
          pvVar28 = vector<duckdb::LogicalType,_true>::operator[]
                              ((vector<duckdb::LogicalType,_true> *)local_2e0._24_8_,__n);
          pvVar17 = vector<duckdb::ColumnBinding,_true>::operator[]
                              ((vector<duckdb::ColumnBinding,_true> *)&local_168,__n);
          pBVar14 = (Binder *)operator_new(0x70);
          LogicalType::LogicalType((LogicalType *)local_2b8,pvVar28);
          binding.table_index = pvVar17->table_index;
          binding.column_index = pvVar17->column_index;
          BoundColumnRefExpression::BoundColumnRefExpression
                    ((BoundColumnRefExpression *)pBVar14,(LogicalType *)local_2b8,binding,0);
          LogicalType::~LogicalType((LogicalType *)local_2b8);
          local_428._0_8_ = pBVar14;
          pvVar28 = vector<duckdb::LogicalType,_true>::operator[](this_01,__n);
          BoundCastExpression::AddDefaultCastToType
                    ((BoundCastExpression *)local_4d8,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)local_428,pvVar28,false);
          uVar12 = local_408._8_8_;
          local_408._8_8_ = local_4d8;
          local_4d8 = (undefined1  [8])0x0;
          if ((element_type *)uVar12 != (element_type *)0x0) {
            (*(code *)(*(_Hash_node_base **)uVar12)[1]._M_nxt)();
          }
          if (local_4d8 != (undefined1  [8])0x0) {
            (**(code **)&(((((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                              *)local_4d8)->_M_t).
                           super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                           .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                         super_BaseExpression).type)();
          }
          local_4d8 = (undefined1  [8])0x0;
          if ((Binder *)local_428._0_8_ != (Binder *)0x0) {
            (*(((Expression *)local_428._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          local_428._0_8_ = (Binder *)0x0;
          local_3f8[0] = *(undefined1 *)
                          &local_5b0[0x12].
                           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
          pLVar26 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                    ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                  *)local_568);
          ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
          emplace_back<duckdb::JoinCondition>
                    (&(pLVar26->conditions).
                      super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>,
                     (JoinCondition *)local_408);
          if ((ClientContext *)local_408._8_8_ != (ClientContext *)0x0) {
            (**(code **)(*(long *)local_408._8_8_ + 8))();
          }
          local_408._8_8_ = (ClientContext *)0x0;
          if ((_Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
               )local_408._0_8_ != (LogicalDependentJoin *)0x0) {
            (**(code **)(*(long *)local_408._0_8_ + 8))();
          }
          __n = __n + 1;
        } while (__n < (ulong)((long)local_5b0[0x10].
                                     super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                     ._M_t.
                                     super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                     .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                     _M_head_impl -
                               (long)local_5b0[0xf].
                                     super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                     ._M_t.
                                     super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                     .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                     _M_head_impl >> 3));
      }
      auVar9 = local_568;
      local_568 = (undefined1  [8])0x0;
      _Var3._M_head_impl =
           (local_598->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (local_598->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (LogicalOperator *)auVar9;
      if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)((long)(_Var3._M_head_impl)->_vptr_LogicalOperator + 8))();
      }
      puVar8 = local_5b0;
      this = (Binder *)local_5b8._M_head_impl;
      (*(code *)(((local_5b0->
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->
                expressions).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage)(local_2b8,local_5b0);
      local_408._0_8_ = local_2e0._16_8_;
      local_408._8_8_ = (ClientContext *)0x0;
      make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding>
                ((duckdb *)local_4d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                 (LogicalType *)(puVar8 + 7),(ColumnBinding *)local_408);
      _Var35._M_head_impl = (BoundComparisonExpression *)local_4d8;
      local_4d8 = (undefined1  [8])0x0;
      if ((_Hash_node_base *)local_2b8._0_8_ != (_Hash_node_base *)(local_2b8 + 0x10)) {
        operator_delete((void *)local_2b8._0_8_);
      }
      pBVar18 = (BoundAtClause *)local_168.super_SimpleFunction.super_Function._vptr_Function;
      if (local_568 != (undefined1  [8])0x0) {
        (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_568)->_M_allocated_capacity + 8))();
        pBVar18 = (BoundAtClause *)local_168.super_SimpleFunction.super_Function._vptr_Function;
      }
      goto LAB_00dbd271;
    }
    local_5b8._M_head_impl = (Expression *)this;
    BoundLimitNode::ConstantValue((BoundLimitNode *)local_408,1);
    BoundLimitNode::BoundLimitNode((BoundLimitNode *)local_568);
    this_02 = (LogicalLimit *)operator_new(0xa8);
    local_2b8._0_8_ = local_408._0_8_;
    local_2b8._8_8_ = local_408._8_8_;
    local_2b8._16_8_ = local_3f8._0_8_;
    aaStack_2a0[0]._0_8_ = local_3f8._8_8_;
    local_3f8._8_8_ =
         (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
         0x0;
    local_168.super_SimpleFunction.super_Function._vptr_Function = (_func_int **)local_568;
    local_168.super_SimpleFunction.super_Function.name._M_dataplus._M_p = (pointer)pCStack_560;
    local_168.super_SimpleFunction.super_Function.name._M_string_length =
         local_558[0]._M_allocated_capacity;
    local_168.super_SimpleFunction.super_Function.name.field_2._M_allocated_capacity =
         local_558[0]._8_8_;
    local_558[0]._8_8_ =
         (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
         0x0;
    LogicalLimit::LogicalLimit(this_02,(BoundLimitNode *)local_2b8,(BoundLimitNode *)&local_168);
    local_4b8._M_allocated_capacity = (size_type)this_02;
    if ((long *)local_168.super_SimpleFunction.super_Function.name.field_2._M_allocated_capacity !=
        (long *)0x0) {
      (**(code **)(*(long *)local_168.super_SimpleFunction.super_Function.name.field_2.
                            _M_allocated_capacity + 8))();
    }
    local_168.super_SimpleFunction.super_Function.name.field_2._M_allocated_capacity = 0;
    if ((long *)aaStack_2a0[0]._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)aaStack_2a0[0]._0_8_ + 8))();
    }
    if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
        local_558[0]._8_8_ != (Expression *)0x0) {
      (**(code **)(*(long *)local_558[0]._8_8_ + 8))();
    }
    if ((Expression *)local_3f8._8_8_ != (Expression *)0x0) {
      (**(code **)(*(long *)local_3f8._8_8_ + 8))();
    }
    this_03 = unique_ptr<duckdb::LogicalLimit,_std::default_delete<duckdb::LogicalLimit>,_true>::
              operator->((unique_ptr<duckdb::LogicalLimit,_std::default_delete<duckdb::LogicalLimit>,_true>
                          *)&local_4b8._M_allocated_capacity);
    local_458._16_8_ = local_5c0._M_head_impl;
    local_5c0._M_head_impl = (LogicalOperator *)0x0;
    LogicalOperator::AddChild
              (&this_03->super_LogicalOperator,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)(local_458 + 0x10));
    if ((element_type *)local_458._16_8_ != (element_type *)0x0) {
      (**(code **)((long)(((enable_shared_from_this<duckdb::Binder> *)local_458._16_8_)->
                         __weak_this_).internal.
                         super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8))()
      ;
    }
    uVar12 = local_4b8._M_allocated_capacity;
    _Var3._M_head_impl = local_5c0._M_head_impl;
    local_458._16_8_ = 0;
    local_4b8._M_allocated_capacity = 0;
    local_5c0._M_head_impl = (LogicalOperator *)uVar12;
    if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
      (*(_Var3._M_head_impl)->_vptr_LogicalOperator[1])();
    }
    CountStarFun::GetFunction();
    FunctionBinder::FunctionBinder((FunctionBinder *)local_428,local_5a0);
    SimpleFunction::SimpleFunction(&local_168.super_SimpleFunction,(SimpleFunction *)local_2b8);
    local_168.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__BaseScalarFunction_0248aa80;
    LogicalType::LogicalType(&local_168.return_type,&LStack_228);
    local_168.stability = local_210;
    local_168.null_handling = FStack_20f;
    local_168.errors = FStack_20e;
    local_168.collation_handling = FStack_20d;
    local_168.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__AggregateFunction_0247e830;
    puVar36 = auStack_208;
    puVar37 = auStack_b8;
    for (lVar34 = 0xd; lVar34 != 0; lVar34 = lVar34 + -1) {
      *puVar37 = *puVar36;
      puVar36 = puVar36 + (ulong)bVar38 * -2 + 1;
      puVar37 = puVar37 + (ulong)bVar38 * -2 + 1;
    }
    local_50 = local_1a0._0_2_;
    local_48 = local_1a0._8_8_;
    local_40 = local_190._M_pi;
    if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_190._M_pi)->_M_use_count = (local_190._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_190._M_pi)->_M_use_count = (local_190._M_pi)->_M_use_count + 1;
      }
    }
    local_4f8.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4f8.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4f8.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_458._0_8_ = (_Hash_node_base *)0x0;
    FunctionBinder::BindAggregateFunction
              ((FunctionBinder *)&local_498,(AggregateFunction *)local_428,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)&local_168,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_4f8,(AggregateType)local_458);
    if ((_Hash_node_base *)local_458._0_8_ != (_Hash_node_base *)0x0) {
      (*(code *)(*(_Hash_node_base **)local_458._0_8_)[1]._M_nxt)();
    }
    local_458._0_8_ = (_Hash_node_base *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector(&local_4f8);
    local_168.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__AggregateFunction_0247e830;
    if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
    }
    BaseScalarFunction::~BaseScalarFunction(&local_168);
    pBVar29 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                            *)&local_498);
    LogicalType::LogicalType(&local_518,&(pBVar29->super_Expression).return_type);
    local_408._0_8_ =
         local_498.
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_4d8 = (undefined1  [8])0x0;
    peStack_4d0 = (element_type *)0x0;
    local_4c8._M_p = (pointer)0x0;
    local_498.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)local_4d8,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               local_408);
    if ((LogicalDependentJoin *)local_408._0_8_ != (LogicalDependentJoin *)0x0) {
      (**(code **)(*(long *)local_408._0_8_ + 8))();
    }
    pBVar14 = local_5a0;
    iVar30 = GenerateTableIndex(local_5a0);
    group_index = GenerateTableIndex(pBVar14);
    pBVar14 = (Binder *)operator_new(0xe0);
    local_408._0_8_ = local_4d8;
    local_408._8_8_ = peStack_4d0;
    local_3f8._0_8_ = local_4c8._M_p;
    local_4d8 = (undefined1  [8])0x0;
    peStack_4d0 = (element_type *)0x0;
    local_4c8._M_p = (pointer)0x0;
    LogicalAggregate::LogicalAggregate
              ((LogicalAggregate *)pBVar14,group_index,iVar30,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)local_408);
    local_588 = (undefined1  [8])pBVar14;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_408);
    pLVar31 = unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
              ::operator->((unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
                            *)local_588);
    local_520._M_head_impl = local_5c0._M_head_impl;
    local_5c0._M_head_impl = (LogicalOperator *)0x0;
    LogicalOperator::AddChild
              (&pLVar31->super_LogicalOperator,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_520);
    if ((LogicalLimit *)local_520._M_head_impl != (LogicalLimit *)0x0) {
      (*((LogicalOperator *)&(local_520._M_head_impl)->_vptr_LogicalOperator)->_vptr_LogicalOperator
        [1])();
    }
    auVar9 = local_588;
    _Var3._M_head_impl = local_5c0._M_head_impl;
    local_520._M_head_impl = (LogicalOperator *)0x0;
    local_588 = (undefined1  [8])0x0;
    local_5c0._M_head_impl = (LogicalOperator *)auVar9;
    if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
      (*(_Var3._M_head_impl)->_vptr_LogicalOperator[1])();
    }
    this_07._M_head_impl = (LogicalDependentJoin *)operator_new(0x70);
    LogicalType::LogicalType((LogicalType *)local_408,&local_518);
    binding_03.column_index = 0;
    binding_03.table_index = iVar30;
    BoundColumnRefExpression::BoundColumnRefExpression
              ((BoundColumnRefExpression *)this_07._M_head_impl,(LogicalType *)local_408,binding_03,
               0);
    LogicalType::~LogicalType((LogicalType *)local_408);
    Value::Numeric((Value *)local_568,&local_518,1);
    _Var32.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)operator_new(0x98);
    Value::Value((Value *)local_408,(Value *)local_568);
    BoundConstantExpression::BoundConstantExpression
              ((BoundConstantExpression *)
               _Var32.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
               (Value *)local_408);
    Value::~Value((Value *)local_408);
    Value::~Value((Value *)local_568);
    this_08.
    super__Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
    .super__Head_base<0UL,_duckdb::LogicalDependentJoin_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
          )operator_new(0x68);
    local_568 = (undefined1  [8])
                _Var32.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    local_408._0_8_ = this_07._M_head_impl;
    BoundComparisonExpression::BoundComparisonExpression
              ((BoundComparisonExpression *)
               this_08.
               super__Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
               .super__Head_base<0UL,_duckdb::LogicalDependentJoin_*,_false>._M_head_impl,
               COMPARE_BOUNDARY_START,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               local_408,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               local_568);
    if ((tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)local_568
        != (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0) {
      (*(((Expression *)local_568)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_568 = (undefined1  [8])0x0;
    if ((_Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
         )local_408._0_8_ != (LogicalDependentJoin *)0x0) {
      (**(code **)(*(long *)local_408._0_8_ + 8))();
    }
    local_568 = (undefined1  [8])0x0;
    pCStack_560 = (ClientContext *)0x0;
    local_558[0]._M_allocated_capacity = (Binder *)0x0;
    local_408._0_8_ =
         this_08.
         super__Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
         .super__Head_base<0UL,_duckdb::LogicalDependentJoin_*,_false>._M_head_impl;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)local_568,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               local_408);
    if ((_Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
         )local_408._0_8_ != (LogicalDependentJoin *)0x0) {
      (**(code **)(*(long *)local_408._0_8_ + 8))();
    }
    table_index_00 = (LogicalDependentJoin *)GenerateTableIndex(local_5a0);
    this_09 = (LogicalProjection *)operator_new(0x70);
    local_408._0_8_ = local_568;
    local_408._8_8_ = pCStack_560;
    local_3f8._0_8_ = local_558[0]._M_allocated_capacity;
    local_568 = (undefined1  [8])0x0;
    pCStack_560 = (ClientContext *)0x0;
    local_558[0]._M_allocated_capacity = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    LogicalProjection::LogicalProjection
              (this_09,(idx_t)table_index_00,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)local_408);
    local_570._M_head_impl = this_09;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_408);
    pLVar33 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
              ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                            *)&local_570);
    this = (Binder *)local_5b8;
    local_578._M_head_impl = (LogicalAggregate *)local_5c0._M_head_impl;
    local_5c0._M_head_impl = (LogicalOperator *)0x0;
    LogicalOperator::AddChild
              (&pLVar33->super_LogicalOperator,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_578);
    if (local_578._M_head_impl != (LogicalAggregate *)0x0) {
      (*((local_578._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
    }
    _Var11._M_head_impl = local_570._M_head_impl;
    _Var3._M_head_impl = local_5c0._M_head_impl;
    local_578._M_head_impl = (LogicalAggregate *)0x0;
    local_570._M_head_impl = (LogicalProjection *)0x0;
    local_5c0._M_head_impl = &(_Var11._M_head_impl)->super_LogicalOperator;
    if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
      (*(_Var3._M_head_impl)->_vptr_LogicalOperator[1])();
    }
    puVar8 = local_598;
    local_528._M_head_impl =
         (local_598->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (local_598->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    local_5a8._M_head_impl = local_5c0._M_head_impl;
    local_5c0._M_head_impl = (LogicalOperator *)0x0;
    LogicalCrossProduct::Create
              ((LogicalCrossProduct *)local_408,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_528,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_5a8);
    uVar12 = local_408._0_8_;
    local_408._0_8_ = (LogicalDependentJoin *)0x0;
    _Var3._M_head_impl =
         (puVar8->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (puVar8->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (LogicalOperator *)uVar12;
    if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)((long)(_Var3._M_head_impl)->_vptr_LogicalOperator + 8))();
    }
    if ((_Tuple_impl<0UL,_duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>
         )local_408._0_8_ != (LogicalDependentJoin *)0x0) {
      (**(code **)(*(long *)local_408._0_8_ + 8))();
    }
    local_408._0_8_ =
         (tuple<duckdb::LogicalDependentJoin_*,_std::default_delete<duckdb::LogicalDependentJoin>_>)
         0x0;
    if ((LogicalProjection *)local_5a8._M_head_impl != (LogicalProjection *)0x0) {
      (*((LogicalOperator *)&(local_5a8._M_head_impl)->_vptr_LogicalOperator)->_vptr_LogicalOperator
        [1])();
    }
    local_5a8._M_head_impl = (LogicalOperator *)0x0;
    if (local_528._M_head_impl != (LogicalOperator *)0x0) {
      (*(local_528._M_head_impl)->_vptr_LogicalOperator[1])();
    }
    local_528._M_head_impl = (LogicalOperator *)0x0;
    (*(code *)(((local_5b0->
                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                )._M_t.
                super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->expressions)
              .
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)(local_408);
    local_188.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_188.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)table_index_00;
    make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalTypeId_const&,duckdb::ColumnBinding>
              ((duckdb *)&local_580,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408,
               &LogicalType::BOOLEAN,(ColumnBinding *)&local_188);
    _Var35._M_head_impl = local_580._M_head_impl;
    local_580._M_head_impl = (BoundComparisonExpression *)0x0;
    if ((ClientContext *)local_408._0_8_ != (ClientContext *)local_3f8) {
      operator_delete((void *)local_408._0_8_);
    }
    if (local_570._M_head_impl != (LogicalProjection *)0x0) {
      (*((local_570._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_568);
    if (local_588 != (undefined1  [8])0x0) {
      (**(code **)((((string *)local_588)->_M_dataplus)._M_p + 8))();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_4d8);
    LogicalType::~LogicalType(&local_518);
    if ((Binder *)
        local_498.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (Binder *)0x0) {
      (*(((LogicalComparisonJoin *)
         &(local_498.
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)->
        super_LogicalJoin).super_LogicalOperator._vptr_LogicalOperator[1])();
    }
    local_2b8._0_8_ = &PTR__AggregateFunction_0247e830;
    if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190._M_pi);
    }
    BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_2b8);
    if ((LogicalOperator *)local_4b8._M_allocated_capacity != (LogicalOperator *)0x0) {
      (**(code **)(*(long *)local_4b8._M_allocated_capacity + 8))();
    }
  }
  pp_Var7 = (((Expression *)this)->super_BaseExpression)._vptr_BaseExpression;
  (((Expression *)this)->super_BaseExpression)._vptr_BaseExpression =
       (_func_int **)_Var35._M_head_impl;
  if (pp_Var7 != (_func_int **)0x0) {
    (**(code **)(*pp_Var7 + 8))();
  }
  if (local_5c0._M_head_impl != (LogicalOperator *)0x0) {
    (*(local_5c0._M_head_impl)->_vptr_LogicalOperator[1])();
  }
  local_5c0._M_head_impl = (LogicalOperator *)0x0;
LAB_00dbd832:
  pBVar14 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)local_2e0);
  if (pBVar14->has_unplanned_dependent_joins == true) {
    local_2b8._0_8_ = &PTR__RecursiveDependentJoinPlanner_02480cc8;
    local_2b8._8_8_ = (pointer)0x0;
    local_2b8._16_8_ = local_5a0;
    op = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
         operator*(local_598);
    RecursiveDependentJoinPlanner::VisitOperator((RecursiveDependentJoinPlanner *)local_2b8,op);
    local_2b8._0_8_ = &PTR__RecursiveDependentJoinPlanner_02480cc8;
    if ((pointer)local_2b8._8_8_ != (pointer)0x0) {
      (*(code *)(*(_Hash_node_base **)local_2b8._8_8_)[1]._M_nxt)();
    }
  }
  if ((element_type *)local_480._0_8_ != (element_type *)0x0) {
    (*(code *)(((((weak_ptr<duckdb::Binder,_true> *)
                 &((BaseExpression *)local_480._0_8_)->_vptr_BaseExpression)->internal).
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._8_8_);
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> Binder::PlanSubquery(BoundSubqueryExpression &expr, unique_ptr<LogicalOperator> &root) {
	D_ASSERT(root);
	// first we translate the QueryNode of the subquery into a logical plan
	auto sub_binder = Binder::CreateBinder(context, this);
	sub_binder->is_outside_flattened = false;
	auto subquery_root = sub_binder->CreatePlan(*expr.subquery);
	D_ASSERT(subquery_root);

	// now we actually flatten the subquery
	auto plan = std::move(subquery_root);

	unique_ptr<Expression> result_expression;
	if (!expr.IsCorrelated()) {
		result_expression = PlanUncorrelatedSubquery(*this, expr, root, std::move(plan));
	} else {
		result_expression = PlanCorrelatedSubquery(*this, expr, root, std::move(plan));
	}
	// finally, we recursively plan the nested subqueries (if there are any)
	if (sub_binder->has_unplanned_dependent_joins) {
		RecursiveDependentJoinPlanner plan(*this);
		plan.VisitOperator(*root);
	}
	return result_expression;
}